

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeop.cc
# Opt level: O1

void __thiscall TypeOpIntSless::TypeOpIntSless(TypeOpIntSless *this,TypeFactory *t)

{
  OpBehavior *pOVar1;
  string local_38;
  
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"<","");
  TypeOp::TypeOp((TypeOp *)this,t,CPUI_INT_SLESS,&local_38);
  (this->super_TypeOpBinary).super_TypeOp._vptr_TypeOp = (_func_int **)&PTR_setMetatypeIn_003c09d0;
  (this->super_TypeOpBinary).metaout = TYPE_BOOL;
  (this->super_TypeOpBinary).metain = TYPE_INT;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  (this->super_TypeOpBinary).super_TypeOp._vptr_TypeOp = (_func_int **)&PTR_setMetatypeIn_003bfa10;
  (this->super_TypeOpBinary).super_TypeOp.opflags = 0x10080;
  (this->super_TypeOpBinary).super_TypeOp.addlflags = 1;
  pOVar1 = (OpBehavior *)operator_new(0x10);
  pOVar1->opcode = CPUI_INT_SLESS;
  pOVar1->isunary = false;
  pOVar1->isspecial = false;
  pOVar1->_vptr_OpBehavior = (_func_int **)&PTR__OpBehavior_003cb2d8;
  (this->super_TypeOpBinary).super_TypeOp.behave = pOVar1;
  return;
}

Assistant:

TypeOpIntSless::TypeOpIntSless(TypeFactory *t)
  : TypeOpBinary(t,CPUI_INT_SLESS,"<",TYPE_BOOL,TYPE_INT)
{
  opflags = PcodeOp::binary | PcodeOp::booloutput;
  addlflags = inherits_sign;
  behave = new OpBehaviorIntSless();
}